

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O0

FrameBuffer *
setupFramebuffer(Header *header,
                list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                *intChannels,
                list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                *halfChannels,
                list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>
                *floatChannels)

{
  bool bVar1;
  char *name;
  Box2i *dataWindow_00;
  Channel *pCVar2;
  FrameBuffer *in_RDI;
  ConstIterator i;
  Box2i dataWindow;
  FrameBuffer *frameBuffer;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff08;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff10;
  FrameBuffer *pFVar3;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff98;
  
  pFVar3 = in_RDI;
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x11756c);
  name = (char *)Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  Imf_3_4::Header::channels();
  Imf_3_4::ChannelList::begin();
  while( true ) {
    Imf_3_4::Header::channels();
    dataWindow_00 = (Box2i *)Imf_3_4::ChannelList::end();
    bVar1 = Imf_3_4::operator!=((ConstIterator *)in_stack_ffffffffffffff10,
                                (ConstIterator *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    pCVar2 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x117631);
    if (*(int *)pCVar2 == 0) {
      Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x11764f);
      Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x117663);
      insertSlice<unsigned_int>
                (dataWindow_00,(FrameBuffer *)in_stack_ffffffffffffff98,name,
                 (PixelType)((ulong)pFVar3 >> 0x20),
                 (list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                  *)in_RDI);
    }
    else {
      pCVar2 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x1176c7);
      if (*(int *)pCVar2 == 1) {
        Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x1176e5);
        Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x1176f9);
        insertSlice<Imath_3_2::half>
                  (dataWindow_00,(FrameBuffer *)in_stack_ffffffffffffff98,name,
                   (PixelType)((ulong)pFVar3 >> 0x20),
                   (list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                    *)in_RDI);
      }
      else {
        pCVar2 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x117737);
        if (*(int *)pCVar2 == 2) {
          Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x117755);
          in_stack_ffffffffffffff10 =
               (Box<Imath_3_2::Vec2<int>_> *)
               Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x117769);
          insertSlice<float>(dataWindow_00,(FrameBuffer *)in_stack_ffffffffffffff98,name,
                             (PixelType)((ulong)pFVar3 >> 0x20),
                             (list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>
                              *)in_RDI);
        }
      }
    }
    in_stack_ffffffffffffff08 =
         (Box<Imath_3_2::Vec2<int>_> *)
         Imf_3_4::ChannelList::ConstIterator::operator++
                   ((ConstIterator *)in_stack_ffffffffffffff08,0);
    in_stack_ffffffffffffff98 = in_stack_ffffffffffffff08;
  }
  return pFVar3;
}

Assistant:

FrameBuffer
setupFramebuffer (
    const Header&            header,
    list<Array2D<uint32_t>>& intChannels,
    list<Array2D<half>>&     halfChannels,
    list<Array2D<float>>&    floatChannels)
{
    //
    // Allocate pixel buffers for all channels specified in the header, describe the layout of
    // the buffers in the FrameBuffer object.
    //

    FrameBuffer frameBuffer;
    Box2i       dataWindow = header.dataWindow ();

    for (auto i = header.channels ().begin (); i != header.channels ().end ();
         i++)
    {
        if (i.channel ().type == UINT)
        {
            insertSlice<uint32_t> (
                dataWindow,
                frameBuffer,
                i.name (),
                i.channel ().type,
                intChannels);
        }
        else if (i.channel ().type == HALF)
        {
            insertSlice<half> (
                dataWindow,
                frameBuffer,
                i.name (),
                i.channel ().type,
                halfChannels);
        }
        else if (i.channel ().type == FLOAT)
        {
            insertSlice<float> (
                dataWindow,
                frameBuffer,
                i.name (),
                i.channel ().type,
                floatChannels);
        }
    }

    return frameBuffer;
}